

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_trim_u32(nng_msg *m,uint32_t *vp)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  byte *pbVar6;
  uint32_t v;
  uint8_t *body;
  uint32_t *vp_local;
  nng_msg *m_local;
  
  sVar5 = nni_msg_len(m);
  if (sVar5 < 4) {
    m_local._4_4_ = 3;
  }
  else {
    pbVar6 = (byte *)nni_msg_body(m);
    bVar1 = *pbVar6;
    bVar2 = pbVar6[1];
    bVar3 = pbVar6[2];
    bVar4 = pbVar6[3];
    nni_msg_trim(m,4);
    *vp = (uint)bVar1 * 0x1000000 + (uint)bVar2 * 0x10000 + (uint)bVar3 * 0x100 + (uint)bVar4;
    m_local._4_4_ = 0;
  }
  return m_local._4_4_;
}

Assistant:

int
nng_msg_trim_u32(nng_msg *m, uint32_t *vp)
{
	uint8_t *body;
	uint32_t v;
	if (nni_msg_len(m) < sizeof(v)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	NNI_GET32(body, v);
	(void) nni_msg_trim(m, sizeof(v));
	*vp = v;
	return (0);
}